

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LazyJSONString.cpp
# Opt level: O0

JavascriptArray * __thiscall
Js::LazyJSONString::ReconstructArray(LazyJSONString *this,JSONArray *jsonArray)

{
  uint32 length_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  JavascriptLibrary *this_00;
  JavascriptArray *pJVar4;
  Var pvVar5;
  undefined4 *puVar6;
  BOOL result;
  Var element;
  uint i;
  JSONProperty *prop;
  JavascriptArray *arr;
  uint32 length;
  JSONArray *jsonArray_local;
  LazyJSONString *this_local;
  
  length_00 = jsonArray->length;
  this_00 = RecyclableObject::GetLibrary((RecyclableObject *)this);
  pJVar4 = JavascriptLibrary::CreateArrayLiteral(this_00,length_00);
  element._4_4_ = 0;
  do {
    if (length_00 <= element._4_4_) {
      return pJVar4;
    }
    pvVar5 = ReconstructVar(this,(JSONProperty *)(jsonArray + (ulong)element._4_4_ * 3 + 1));
    iVar3 = (*(pJVar4->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x29])(pJVar4,(ulong)element._4_4_,pvVar5,0);
    if (iVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/LazyJSONString.cpp"
                                  ,0x7d,"(result)","result");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    element._4_4_ = element._4_4_ + 1;
  } while( true );
}

Assistant:

JavascriptArray*
LazyJSONString::ReconstructArray(_In_ JSONArray* jsonArray) const
{
    const uint32 length = jsonArray->length;
    JavascriptArray* arr = this->GetLibrary()->CreateArrayLiteral(length);
    JSONProperty* prop = jsonArray->arr;
    for (uint i = 0; i < length; ++i)
    {
        Var element = ReconstructVar(&prop[i]);
        BOOL result = arr->SetItem(i, element, PropertyOperation_None);
        Assert(result); // Setting item in an array we just allocated should always succeed
    }
    return arr;
}